

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void req0_ctx_send(void *arg,nni_aio *aio)

{
  req0_sock *s_00;
  _Bool _Var1;
  nng_err result;
  int iVar2;
  nni_msg *m;
  size_t sVar3;
  nni_time nVar4;
  int rv;
  nng_msg *msg;
  req0_sock *s;
  req0_ctx *ctx;
  nni_aio *aio_local;
  void *arg_local;
  
  s_00 = *arg;
  m = nni_aio_get_msg(aio);
  nni_mtx_lock(&s_00->mtx);
  if ((s_00->closed & 1U) == 0) {
    if (*(long *)((long)arg + 0x50) != 0) {
      nni_aio_finish_error(*(nni_aio **)((long)arg + 0x50),NNG_ECANCELED);
      *(undefined8 *)((long)arg + 0x50) = 0;
    }
    if (*(long *)((long)arg + 0x58) != 0) {
      nni_aio_set_msg(*(nni_aio **)((long)arg + 0x58),*(nni_msg **)((long)arg + 0x60));
      nni_msg_header_clear(*(nni_msg **)((long)arg + 0x60));
      *(undefined8 *)((long)arg + 0x60) = 0;
      nni_aio_finish_error(*(nni_aio **)((long)arg + 0x58),NNG_ECANCELED);
      *(undefined8 *)((long)arg + 0x58) = 0;
      nni_list_remove(&s_00->send_queue,arg);
    }
    req0_ctx_reset((req0_ctx *)arg);
    result = nni_id_alloc32(&s_00->requests,(uint32_t *)((long)arg + 0x48),arg);
    if (result == NNG_OK) {
      nni_msg_header_clear(m);
      nni_msg_header_append_u32(m,*(uint32_t *)((long)arg + 0x48));
      iVar2 = nni_list_empty(&s_00->ready_pipes);
      if ((iVar2 == 0) || (_Var1 = nni_aio_start(aio,req0_ctx_cancel_send,arg), _Var1)) {
        sVar3 = nni_msg_len(m);
        *(size_t *)((long)arg + 0x68) = sVar3;
        *(nni_msg **)((long)arg + 0x60) = m;
        *(nni_aio **)((long)arg + 0x58) = aio;
        nni_aio_set_msg(aio,(nni_msg *)0x0);
        if (0 < *(int *)((long)arg + 0x78)) {
          nVar4 = nni_clock();
          *(nni_time *)((long)arg + 0x80) = nVar4 + (long)*(int *)((long)arg + 0x78);
          nni_list_append(&s_00->retry_queue,arg);
          if ((s_00->retry_active & 1U) == 0) {
            s_00->retry_active = true;
            nni_sleep_aio(s_00->retry_tick,&s_00->retry_aio);
          }
        }
        nni_list_append(&s_00->send_queue,arg);
        req0_run_send_queue(s_00,(nni_aio_completions *)0x0);
        nni_mtx_unlock(&s_00->mtx);
      }
      else {
        nni_id_remove(&s_00->requests,(ulong)*(uint *)((long)arg + 0x48));
        nni_mtx_unlock(&s_00->mtx);
      }
    }
    else {
      nni_mtx_unlock(&s_00->mtx);
      nni_aio_finish_error(aio,result);
    }
  }
  else {
    nni_mtx_unlock(&s_00->mtx);
    nni_aio_finish_error(aio,NNG_ECLOSED);
  }
  return;
}

Assistant:

static void
req0_ctx_send(void *arg, nni_aio *aio)
{
	req0_ctx  *ctx = arg;
	req0_sock *s   = ctx->sock;
	nng_msg   *msg = nni_aio_get_msg(aio);
	int        rv;

	nni_mtx_lock(&s->mtx);
	if (s->closed) {
		nni_mtx_unlock(&s->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	// Sending a new request cancels the old one, including any
	// outstanding reply.
	if (ctx->recv_aio != NULL) {
		nni_aio_finish_error(ctx->recv_aio, NNG_ECANCELED);
		ctx->recv_aio = NULL;
	}
	if (ctx->send_aio != NULL) {
		nni_aio_set_msg(ctx->send_aio, ctx->req_msg);
		nni_msg_header_clear(ctx->req_msg);
		ctx->req_msg = NULL;
		nni_aio_finish_error(ctx->send_aio, NNG_ECANCELED);
		ctx->send_aio = NULL;
		nni_list_remove(&s->send_queue, ctx);
	}

	// This resets the entire state machine.
	req0_ctx_reset(ctx);

	// Insert us on the per ID hash list, so that receives can find us.
	if ((rv = nni_id_alloc32(&s->requests, &ctx->request_id, ctx)) != 0) {
		nni_mtx_unlock(&s->mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_msg_header_clear(msg);
	nni_msg_header_append_u32(msg, ctx->request_id);

	// only do asynch if we're going to defer -- this is somewhat subtle
	// because we can have been submitted for a non-blocking operation and
	// in that case we would not like to timeout the operation instantly.
	if (nni_list_empty(&s->ready_pipes) &&
	    !nni_aio_start(aio, req0_ctx_cancel_send, ctx)) {
		nni_id_remove(&s->requests, ctx->request_id);
		nni_mtx_unlock(&s->mtx);
		return;
	}
	ctx->req_len  = nni_msg_len(msg);
	ctx->req_msg  = msg;
	ctx->send_aio = aio;
	nni_aio_set_msg(aio, NULL);

	if (ctx->retry > 0) {
		ctx->retry_time = nni_clock() + ctx->retry;
		nni_list_append(&s->retry_queue, ctx);
		if (!s->retry_active) {
			s->retry_active = true;
			nni_sleep_aio(s->retry_tick, &s->retry_aio);
		}
	}

	// Stick us on the send_queue list.
	nni_list_append(&s->send_queue, ctx);

	req0_run_send_queue(s, NULL);
	nni_mtx_unlock(&s->mtx);
}